

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O2

void blend_a64_vmask_bn_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h,blend_unit_fn blend)

{
  long lVar1;
  long lVar2;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb;
  __m128i alVar9;
  __m128i alVar10;
  long lVar3;
  
  lVar3 = (ulong)src1_stride * 2;
  lVar1 = (ulong)src0_stride * 2;
  puVar4 = src0;
  puVar6 = src1;
  do {
    auVar8 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
    pmovsxbw(auVar8,0x4040404040404040);
    puVar5 = puVar4;
    puVar7 = puVar6;
    for (lVar2 = 0; lVar2 < w; lVar2 = lVar2 + 8) {
      alVar9[1] = lVar1;
      alVar9[0] = (longlong)src0;
      alVar10[1] = lVar3;
      alVar10[0] = (longlong)src1;
      alVar9 = (*blend)(puVar5,puVar7,alVar9,alVar10);
      src0 = alVar9[1];
      *(undefined8 *)(dst + lVar2) = extraout_XMM0_Qa;
      *(undefined8 *)(dst + lVar2 + 4) = extraout_XMM0_Qb;
      puVar7 = puVar7 + 8;
      puVar5 = puVar5 + 8;
    }
    mask = mask + 1;
    dst = dst + dst_stride;
    puVar6 = puVar6 + src1_stride;
    puVar4 = puVar4 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_vmask_bn_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, int w, int h, blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);
    for (c = 0; c < w; c += 8) {
      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}